

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_suite.cpp
# Opt level: O2

void string_suite::test_view(void)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  string_view view;
  string data;
  writer writer;
  size_type local_d8;
  undefined4 local_cc;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  string_view_type local_a8;
  char *local_98 [4];
  basic_writer<16UL> local_78;
  
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trial::protocol::bintoken::basic_writer<16ul>::
  basic_writer<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_writer<16ul> *)&local_78,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,"ABC",(allocator<char> *)&local_a8);
  local_a8._M_len = strlen(local_98[0]);
  local_a8._M_str = local_98[0];
  local_d8 = trial::protocol::bintoken::detail::basic_encoder<16UL>::value
                       (&local_78.encoder,&local_a8);
  local_cc = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("writer.value(view)","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x145,"void string_suite::test_view()",&local_d8,&local_cc);
  local_d8 = (long)local_c8._M_impl.super__Vector_impl_data._M_finish -
             (long)local_c8._M_impl.super__Vector_impl_data._M_start;
  local_cc = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("result.size()","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x146,"void string_suite::test_view()",&local_d8,&local_cc);
  local_d8._0_4_ = 0xa9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,unsigned_char,trial::protocol::bintoken::token::code::value>
            ("result[0]","token::code::string8",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x147,"void string_suite::test_view()",
             local_c8._M_impl.super__Vector_impl_data._M_start,&local_d8);
  local_d8._0_4_ = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[1]","0x03",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x148,"void string_suite::test_view()",
             local_c8._M_impl.super__Vector_impl_data._M_start + 1,&local_d8);
  local_d8._0_4_ = 0x41;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[2]","0x41",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x149,"void string_suite::test_view()",
             local_c8._M_impl.super__Vector_impl_data._M_start + 2,&local_d8);
  local_d8._0_4_ = 0x42;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[3]","0x42",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x14a,"void string_suite::test_view()",
             local_c8._M_impl.super__Vector_impl_data._M_start + 3,&local_d8);
  local_d8 = CONCAT44(local_d8._4_4_,0x43);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("result[4]","0x43",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/writer_suite.cpp"
             ,0x14b,"void string_suite::test_view()",
             local_c8._M_impl.super__Vector_impl_data._M_start + 4,&local_d8);
  std::__cxx11::string::~string((string *)local_98);
  trial::protocol::bintoken::basic_writer<16UL>::~basic_writer(&local_78);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c8);
  return;
}

Assistant:

void test_uint8()
{
    std::vector<output_type> result;
    format::writer writer(result);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0x00)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0x7F)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0xD0)), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(writer.value(std::uint8_t(0xFF)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.size(), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(result[0], 0x00);
    TRIAL_PROTOCOL_TEST_EQUAL(result[1], 0x7F);
    TRIAL_PROTOCOL_TEST_EQUAL(result[2], token::code::int8);
    TRIAL_PROTOCOL_TEST_EQUAL(result[3], 0xD0);
    TRIAL_PROTOCOL_TEST_EQUAL(result[4], 0xFF);
}